

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

void __thiscall asmjit::VMemMgr::~VMemMgr(VMemMgr *this)

{
  pthread_mutex_t *in_RDI;
  PermanentNode *prev;
  PermanentNode *node;
  VMemMgr *in_stack_ffffffffffffffd8;
  undefined8 *puVar1;
  undefined8 local_20;
  
  vMemMgrReset(in_stack_ffffffffffffffd8,SUB81((ulong)in_RDI >> 0x38,0));
  local_20 = *(undefined8 **)((long)in_RDI + 0x70);
  while (local_20 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_20;
    free(local_20);
    local_20 = puVar1;
  }
  pthread_mutex_destroy(in_RDI);
  return;
}

Assistant:

VMemMgr::~VMemMgr() noexcept {
  // Freeable memory cleanup - Also frees the virtual memory if configured to.
  vMemMgrReset(this, _keepVirtualMemory);

  // Permanent memory cleanup - Never frees the virtual memory.
  PermanentNode* node = _permanent;
  while (node) {
    PermanentNode* prev = node->prev;
    Internal::releaseMemory(node);
    node = prev;
  }
}